

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::RequestBuilder::~RequestBuilder(RequestBuilder *this)

{
  RequestBuilder *this_local;
  
  std::function<void_(const_restincurl::Result_&)>::~function(&this->completion_);
  std::__cxx11::string::~string((string *)&this->url_);
  std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::~unique_ptr
            (&this->options_);
  std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::~unique_ptr
            (&this->request_);
  return;
}

Assistant:

~RequestBuilder() {
        }